

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::DragBehaviorT<unsigned_int,int,float>
               (ImGuiDataType data_type,uint *v,float v_speed,uint v_min,uint v_max,char *format,
               ImGuiSliderFlags flags)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  uint uVar6;
  ImGuiInputSource IVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  byte bVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  float local_88;
  float local_78;
  ImVec2 local_50;
  undefined1 local_48 [16];
  
  pIVar4 = GImGui;
  uVar6 = data_type & 0xfffffffe;
  uVar12 = v_max - v_min;
  if (v_speed == 0.0 && (v_min <= v_max && uVar12 != 0)) {
    v_speed = (float)uVar12 * GImGui->DragSpeedDefaultRatio;
  }
  uVar10 = (flags & 0x100000U) >> 0x14;
  IVar7 = GImGui->ActiveIdSource;
  if (IVar7 == ImGuiInputSource_Mouse) {
    bVar5 = IsMousePosValid((ImVec2 *)0x0);
    if ((!bVar5) || ((pIVar4->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) {
      IVar7 = pIVar4->ActiveIdSource;
      goto LAB_001cbd5d;
    }
    fVar14 = (pIVar4->IO).NavInputs[(ulong)uVar10 + 0x1d];
    if ((pIVar4->IO).KeyAlt != false) {
      fVar14 = fVar14 * 0.01;
    }
    if ((pIVar4->IO).KeyShift == true) {
      fVar14 = fVar14 * 10.0;
    }
  }
  else {
LAB_001cbd5d:
    fVar14 = 0.0;
    if (IVar7 == ImGuiInputSource_Nav) {
      uVar8 = 0;
      if (uVar6 == 8) {
        uVar8 = ImParseFormatPrecision(format,3);
      }
      local_50 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      fVar14 = *(float *)(local_48 + (ulong)uVar10 * 4 + -8);
      if ((int)uVar8 < 0) {
        fVar13 = 1.1754944e-38;
      }
      else if (uVar8 < 10) {
        fVar13 = *(float *)(GetMinimumStepAtDecimalPrecision(int)::min_steps + (ulong)uVar8 * 4);
      }
      else {
        local_48 = ZEXT416((uint)fVar14);
        fVar13 = powf(10.0,(float)(int)-uVar8);
        fVar14 = (float)local_48._0_4_;
      }
      v_speed = (float)((uint)v_speed & -(uint)(fVar13 <= v_speed) |
                       ~-(uint)(fVar13 <= v_speed) & (uint)fVar13);
    }
  }
  bVar11 = uVar6 == 8 & (byte)((flags & 0x20U) >> 5);
  fVar14 = fVar14 * v_speed;
  if ((flags & 0x100000U) != 0) {
    fVar14 = -fVar14;
  }
  fVar13 = fVar14;
  if (bVar11 != 0) {
    fVar13 = fVar14 / (float)uVar12;
  }
  bVar5 = false;
  if (v_max == v_min) {
    fVar13 = fVar14;
  }
  if (v_min < v_max) {
    if ((v_max <= *v) && (0.0 < fVar13)) goto LAB_001cbebb;
    bVar5 = fVar13 < 0.0 && *v <= v_min;
  }
  if ((pIVar4->ActiveIdIsJustActivated == false) && (!bVar5)) {
    if ((fVar13 != 0.0) || (NAN(fVar13))) {
      pIVar4->DragCurrentAccum = pIVar4->DragCurrentAccum + fVar13;
      pIVar4->DragCurrentAccumDirty = true;
    }
    else if ((pIVar4->DragCurrentAccumDirty & 1U) == 0) {
      return false;
    }
    uVar12 = *v;
    if (bVar11 == 0) {
      local_78 = 0.0;
      local_88 = 0.0;
      uVar12 = uVar12 + (int)pIVar4->DragCurrentAccum;
    }
    else {
      iVar9 = ImParseFormatPrecision(format,3);
      local_88 = powf(0.1,(float)iVar9);
      local_78 = ScaleRatioFromValueT<unsigned_int,int,float>
                           (data_type,uVar12,v_min,v_max,true,local_88,0.0);
      uVar12 = 0;
      if (((v_max != v_min) &&
          (fVar14 = local_78 + pIVar4->DragCurrentAccum, uVar12 = v_min, 0.0 < fVar14)) &&
         (uVar12 = v_max, fVar14 < 1.0)) {
        fVar2 = local_88;
        if (local_88 <= (float)v_min) {
          fVar2 = (float)v_min;
        }
        fVar1 = local_88;
        if (local_88 <= (float)v_max) {
          fVar1 = (float)v_max;
        }
        fVar3 = fVar2;
        if (v_max < v_min) {
          fVar14 = 1.0 - fVar14;
          fVar3 = fVar1;
          fVar1 = fVar2;
        }
        fVar14 = powf(fVar1 / fVar3,fVar14);
        uVar12 = (uint)(long)(fVar14 * fVar3);
      }
    }
    if ((flags & 0x40U) == 0) {
      uVar12 = RoundScalarWithFormatT<unsigned_int,int>(format,data_type,uVar12);
    }
    pIVar4->DragCurrentAccumDirty = false;
    if (bVar11 == 0) {
      uVar10 = *v;
      pIVar4->DragCurrentAccum = pIVar4->DragCurrentAccum - (float)(int)(uVar12 - uVar10);
    }
    else {
      fVar14 = ScaleRatioFromValueT<unsigned_int,int,float>
                         (data_type,uVar12,v_min,v_max,true,local_88,0.0);
      pIVar4->DragCurrentAccum = pIVar4->DragCurrentAccum - (fVar14 - local_78);
      uVar10 = *v;
    }
    if ((v_min < v_max) && (uVar10 != uVar12)) {
      if ((uVar12 < v_min) || (((uVar6 != 8 && (uVar10 < uVar12)) && (fVar13 < 0.0)))) {
        uVar12 = v_min;
      }
      if ((v_max < uVar12) || (((uVar6 != 8 && (uVar12 < uVar10)) && (0.0 < fVar13)))) {
        uVar12 = v_max;
      }
    }
    if (uVar10 == uVar12) {
      return false;
    }
    *v = uVar12;
    return true;
  }
LAB_001cbebb:
  pIVar4->DragCurrentAccum = 0.0;
  pIVar4->DragCurrentAccumDirty = false;
  return false;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) && is_decimal;

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f * 1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}